

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

uint8 * google::protobuf::internal::WireFormatLite::WritePrimitiveNoTagToArray<long>
                  (RepeatedField<long> *value,_func_uint8_ptr_long_uint8_ptr *Writer,uint8 *target)

{
  int iVar1;
  LogMessage *other;
  long *plVar2;
  long lVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar1 = value->current_size_;
  if ((long)iVar1 < 1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite_inl.h"
               ,0x2a4);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (n) > (0): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  plVar2 = RepeatedField<long>::unsafe_data(value);
  lVar3 = 0;
  do {
    target = (*Writer)(plVar2[lVar3],target);
    lVar3 = lVar3 + 1;
  } while (lVar3 < iVar1);
  return target;
}

Assistant:

inline uint8* WireFormatLite::WritePrimitiveNoTagToArray(
      const RepeatedField<T>& value,
      uint8* (*Writer)(T, uint8*), uint8* target) {
  const int n = value.size();
  GOOGLE_DCHECK_GT(n, 0);

  const T* ii = value.unsafe_data();
  int i = 0;
  do {
    target = Writer(ii[i], target);
  } while (++i < n);

  return target;
}